

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TreePop(void)

{
  ImU32 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  uint uVar5;
  ImRect local_28;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  Unindent(0.0);
  uVar5 = (pIVar2->DC).TreeDepth - 1;
  (pIVar2->DC).TreeDepth = uVar5;
  uVar5 = 1 << (uVar5 & 0x1f);
  if ((pIVar3->NavMoveDir == 0) && (pIVar3->NavWindow == pIVar2)) {
    bVar4 = NavMoveRequestButNoResultYet();
    if ((bVar4) &&
       ((pIVar3->NavIdIsAlive == true && (((pIVar2->DC).TreeJumpToParentOnPopMask & uVar5) != 0))))
    {
      local_28.Min.x = 0.0;
      local_28.Min.y = 0.0;
      local_28.Max.x = 0.0;
      local_28.Max.y = 0.0;
      SetNavID((pIVar2->IDStack).Data[(long)(pIVar2->IDStack).Size + -1],pIVar3->NavLayer,0,
               &local_28);
      NavMoveRequestCancel();
    }
  }
  pIVar1 = &(pIVar2->DC).TreeJumpToParentOnPopMask;
  *pIVar1 = *pIVar1 & uVar5 - 1;
  PopID();
  return;
}

Assistant:

void ImGui::TreePop()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    Unindent();

    window->DC.TreeDepth--;
    ImU32 tree_depth_mask = (1 << window->DC.TreeDepth);

    // Handle Left arrow to move to parent tree node (when ImGuiTreeNodeFlags_NavLeftJumpsBackHere is enabled)
    if (g.NavMoveDir == ImGuiDir_Left && g.NavWindow == window && NavMoveRequestButNoResultYet())
        if (g.NavIdIsAlive && (window->DC.TreeJumpToParentOnPopMask & tree_depth_mask))
        {
            SetNavID(window->IDStack.back(), g.NavLayer, 0, ImRect());
            NavMoveRequestCancel();
        }
    window->DC.TreeJumpToParentOnPopMask &= tree_depth_mask - 1;

    IM_ASSERT(window->IDStack.Size > 1); // There should always be 1 element in the IDStack (pushed during window creation). If this triggers you called TreePop/PopID too much.
    PopID();
}